

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppq.cpp
# Opt level: O0

void __thiscall pg::PPQSolver::solve(PPQSolver *this,int vtop,int pr,int prc,int pe,int po)

{
  unsigned_long *puVar1;
  uint64_t *puVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  void *this_00;
  int iVar7;
  _label_vertex _Var8;
  bitset local_258;
  _label_vertex local_238;
  int local_224;
  size_t sStack_220;
  int v_8;
  size_t v_7;
  undefined1 local_210 [3];
  bool reset_R;
  int v_6;
  undefined1 local_200 [16];
  undefined1 local_1f0 [28];
  int v_5;
  int local_1d0;
  _label_vertex local_1c8;
  Game *local_1b8;
  int local_1b0;
  _label_vertex local_1a8;
  size_t local_198;
  size_t v_4;
  int v_3;
  int subpr;
  undefined1 local_178 [28];
  int next_vtop;
  bitset Z;
  bool promoted;
  _label_vertex local_128;
  size_t local_118;
  size_t v_2;
  undefined1 local_108 [4];
  int v_1;
  undefined1 local_f8 [24];
  undefined1 local_e0 [4];
  int v;
  uint local_cc;
  undefined1 local_c8 [4];
  int pl;
  int local_b4;
  int local_b0;
  int po_local;
  int pe_local;
  int prc_local;
  int pr_local;
  int vtop_local;
  PPQSolver *this_local;
  uintqueue *local_90;
  uint local_84;
  uintqueue *local_80;
  uintqueue *local_78;
  uintqueue *local_70;
  uintqueue *local_68;
  uintqueue *local_60;
  char local_51;
  bitset *local_50;
  char local_41;
  bitset *local_40;
  char local_31;
  bitset *local_30;
  char local_21;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  this->iterations = this->iterations + 1;
  if ((po != 0) &&
     (local_b4 = po, local_b0 = pe, po_local = prc, pe_local = pr, prc_local = vtop,
     _pr_local = this, pe != 0)) {
    while( true ) {
      bVar3 = false;
      if (-1 < prc_local) {
        bitset::operator[]((bitset *)local_c8,(size_t)&this->G);
        bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_c8);
        bVar3 = true;
        if ((bVar4) && (bVar3 = true, this->r[prc_local] <= pe_local)) {
          bVar3 = pe_local < this->u[prc_local];
        }
      }
      if (!bVar3) break;
      prc_local = prc_local + -1;
    }
    if (prc_local != -1) {
      local_cc = pe_local & 1;
      if (local_cc == 0) {
        solve(this,prc_local,pe_local,po_local,local_b0,local_b4 / 2);
      }
      else {
        solve(this,prc_local,pe_local,po_local,local_b0 / 2,local_b4);
      }
      if (1 < (this->super_Solver).trace) {
        poVar5 = std::operator<<((this->super_Solver).logger,"in pr=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pe_local);
        poVar5 = std::operator<<(poVar5,", pe=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b0);
        poVar5 = std::operator<<(poVar5,", po=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b4);
        poVar5 = std::operator<<(poVar5," (caller pr=");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,po_local);
        poVar5 = std::operator<<(poVar5,")");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      while( true ) {
        bVar3 = false;
        if (-1 < prc_local) {
          bitset::operator[]((bitset *)local_e0,(size_t)&this->G);
          bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_e0);
          bVar3 = true;
          if ((bVar4) && (bVar3 = true, this->r[prc_local] <= pe_local)) {
            bVar3 = pe_local < this->u[prc_local];
          }
        }
        if (!bVar3) break;
        prc_local = prc_local + -1;
      }
      if (prc_local != -1) {
        local_10 = &this->R;
        puVar1 = local_10->_bits;
        puVar2 = local_10->_bits;
        sVar6 = bitset::num_blocks(local_10);
        local_11 = '\0';
        std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar6,&local_11);
        local_20 = &this->L;
        puVar1 = local_20->_bits;
        puVar2 = local_20->_bits;
        sVar6 = bitset::num_blocks(local_20);
        local_21 = '\0';
        std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar6,&local_21);
        for (local_f8._20_4_ = prc_local; -1 < (int)local_f8._20_4_;
            local_f8._20_4_ = local_f8._20_4_ - 1) {
          if (this->r[(int)local_f8._20_4_] != -1) {
            if (this->r[(int)local_f8._20_4_] == pe_local) {
              bitset::operator[]((bitset *)local_f8,(size_t)&this->R);
              bitset::reference::operator=((reference *)local_f8,true);
              local_80 = &this->Q;
              local_84 = local_f8._20_4_;
              iVar7 = (this->Q).pointer;
              (this->Q).pointer = iVar7 + 1;
              local_80->queue[iVar7] = local_f8._20_4_;
            }
            if (this->r[(int)local_f8._20_4_] <= pe_local) {
              bitset::operator[]((bitset *)local_108,(size_t)&this->L);
              bitset::reference::operator=((reference *)local_108,true);
            }
          }
        }
        while (local_70 = &this->Q, (this->Q).pointer != 0) {
          local_60 = &this->Q;
          iVar7 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar7;
          v_2._4_4_ = local_60->queue[iVar7];
          this->r[(int)v_2._4_4_] = pe_local;
          attractVertices(this,local_cc,v_2._4_4_,&this->R,&this->L,&this->L);
        }
        if (1 < (this->super_Solver).trace) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pe_local);
          std::operator<<(poVar5,"\x1b[m");
          for (local_118 = bitset::find_last(&this->R); local_118 != 0xffffffffffffffff;
              local_118 = bitset::find_prev(&this->R,local_118)) {
            poVar5 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
            _Var8 = Solver::label_vertex(&this->super_Solver,(int)local_118);
            local_128.g = _Var8.g;
            local_128.v = _Var8.v;
            poVar5 = operator<<(poVar5,&local_128);
            std::operator<<(poVar5,"\x1b[m");
          }
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        Z._allocsize._7_1_ = maybePromote(this,pe_local,local_cc,&this->R,&this->L);
        if (!(bool)Z._allocsize._7_1_) {
          bitset::bitset((bitset *)(local_178 + 0x18),&this->R);
          local_178._20_4_ = prc_local;
          while( true ) {
            bVar3 = false;
            if (-1 < (int)local_178._20_4_) {
              bitset::operator[]((bitset *)local_178,(size_t)&this->G);
              bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_178);
              bVar3 = true;
              if ((bVar4) && (bVar3 = true, this->r[(int)local_178._20_4_] < pe_local)) {
                bVar3 = pe_local <= this->u[(int)local_178._20_4_];
              }
            }
            if (!bVar3) break;
            local_178._20_4_ = local_178._20_4_ + -1;
          }
          if (local_178._20_4_ == -1) {
            v_3 = 1;
          }
          else {
            v_4._4_4_ = this->r[(int)local_178._20_4_];
            solve(this,prc_local,v_4._4_4_,pe_local,local_b0,local_b4);
            if (1 < (this->super_Solver).trace) {
              poVar5 = std::operator<<((this->super_Solver).logger,"back from recursive ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,v_4._4_4_);
              poVar5 = std::operator<<(poVar5,", we are pr ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,pe_local);
              poVar5 = std::operator<<(poVar5,", pe=");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_b0);
              poVar5 = std::operator<<(poVar5,", po=");
              this_00 = (void *)std::ostream::operator<<(poVar5,local_b4);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            }
            for (v_4._0_4_ = prc_local; -1 < (int)v_4; v_4._0_4_ = (int)v_4 + -1) {
              if ((this->u[(int)v_4] == -1) || (pe_local <= this->u[(int)v_4])) {
                if (((v_4._4_4_ & 1) != local_cc) &&
                   ((this->r[(int)v_4] != -1 && (this->r[(int)v_4] < pe_local)))) {
                  this->r[(int)v_4] = -1;
                  this->u[(int)v_4] = pe_local;
                }
              }
              else if ((this->u[(int)v_4] & 1U) == local_cc) {
                this->u[(int)v_4] = pe_local;
              }
              else {
                this->u[(int)v_4] = -1;
                iVar7 = Solver::priority(&this->super_Solver,(int)v_4);
                this->r[(int)v_4] = iVar7;
                this->str[(int)v_4] = -1;
              }
            }
            if (1 < (this->super_Solver).trace) {
              poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1mstate after Und\x1b[m");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              for (local_198 = bitset::find_last(&this->G); local_198 != 0xffffffffffffffff;
                  local_198 = bitset::find_prev(&this->G,local_198)) {
                poVar5 = (this->super_Solver).logger;
                _Var8 = Solver::label_vertex(&this->super_Solver,(int)local_198);
                local_1b8 = _Var8.g;
                local_1b0 = _Var8.v;
                local_1a8.g = local_1b8;
                local_1a8.v = local_1b0;
                poVar5 = operator<<(poVar5,&local_1a8);
                poVar5 = std::operator<<(poVar5," r=");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->r[local_198]);
                poVar5 = std::operator<<(poVar5," u=");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->u[local_198]);
                poVar5 = std::operator<<(poVar5," str=");
                _Var8 = Solver::label_vertex(&this->super_Solver,this->str[local_198]);
                register0x00000000 = _Var8.g;
                local_1d0 = _Var8.v;
                local_1c8.g = register0x00000000;
                local_1c8.v = local_1d0;
                poVar5 = operator<<(poVar5,&local_1c8);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
            }
            local_30 = &this->R;
            puVar1 = local_30->_bits;
            sVar6 = bitset::num_blocks(local_30);
            local_31 = '\0';
            std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar6,&local_31);
            local_40 = &this->L;
            puVar1 = local_40->_bits;
            sVar6 = bitset::num_blocks(local_40);
            local_41 = '\0';
            std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar6,&local_41);
            local_50 = &this->U;
            puVar1 = local_50->_bits;
            sVar6 = bitset::num_blocks(local_50);
            local_51 = '\0';
            std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar6,&local_51);
            for (local_1f0._20_4_ = prc_local; -1 < (int)local_1f0._20_4_;
                local_1f0._20_4_ = local_1f0._20_4_ - 1) {
              if (this->r[(int)local_1f0._20_4_] == pe_local) {
                bitset::operator[]((bitset *)local_1f0,(size_t)&this->R);
                bitset::reference::operator=((reference *)local_1f0,true);
              }
              if ((this->r[(int)local_1f0._20_4_] != -1) &&
                 (this->r[(int)local_1f0._20_4_] <= pe_local)) {
                bitset::operator[]((bitset *)local_200,(size_t)&this->L);
                bitset::reference::operator=((reference *)local_200,true);
              }
              if (this->u[(int)local_1f0._20_4_] == pe_local) {
                bitset::operator[]((bitset *)local_210,(size_t)&this->U);
                bitset::reference::operator=((reference *)local_210,true);
                local_90 = &this->Q;
                this_local._4_4_ = local_1f0._20_4_;
                iVar7 = (this->Q).pointer;
                (this->Q).pointer = iVar7 + 1;
                local_90->queue[iVar7] = local_1f0._20_4_;
              }
            }
            while (local_78 = &this->Q, (this->Q).pointer != 0) {
              local_68 = &this->Q;
              iVar7 = (this->Q).pointer + -1;
              (this->Q).pointer = iVar7;
              v_7._4_4_ = local_68->queue[iVar7];
              this->u[(int)v_7._4_4_] = pe_local;
              this->r[(int)v_7._4_4_] = -1;
              attractVertices(this,1 - local_cc,v_7._4_4_,&this->U,&this->L,&this->L);
            }
            bitset::operator-=(&this->R,&this->U);
            bitset::operator-=(&this->L,&this->U);
            bitset::operator|=(&this->R,(bitset *)(local_178 + 0x18));
            v_7._3_1_ = 0;
            for (sStack_220 = bitset::find_first(&this->R); sStack_220 != 0xffffffffffffffff;
                sStack_220 = bitset::find_next(&this->R,sStack_220)) {
              if (this->r[sStack_220] == -1) {
                v_7._3_1_ = 1;
                break;
              }
              if ((pe_local < this->r[sStack_220]) && ((this->r[sStack_220] & 1U) != local_cc)) {
                v_7._3_1_ = 1;
                break;
              }
              if ((this->str[sStack_220] != -1) && (this->r[this->str[sStack_220]] != pe_local)) {
                v_7._3_1_ = 1;
                break;
              }
            }
            if ((v_7._3_1_ & 1) == 0) {
              maybePromote(this,pe_local,local_cc,&this->R,&this->L);
              v_3 = 1;
            }
            else {
              for (local_224 = prc_local; -1 < local_224; local_224 = local_224 + -1) {
                if ((this->r[local_224] != -1) && (this->r[local_224] <= pe_local)) {
                  if (1 < (this->super_Solver).trace) {
                    poVar5 = std::operator<<((this->super_Solver).logger,"reset ");
                    _Var8 = Solver::label_vertex(&this->super_Solver,local_224);
                    local_258._bitssize = (size_t)_Var8.g;
                    local_258._allocsize._0_4_ = _Var8.v;
                    local_238.g = (Game *)local_258._bitssize;
                    local_238.v = (int)local_258._allocsize;
                    poVar5 = operator<<(poVar5,&local_238);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  }
                  iVar7 = Solver::priority(&this->super_Solver,local_224);
                  this->r[local_224] = iVar7;
                  this->u[local_224] = -1;
                  this->str[local_224] = -1;
                }
              }
              while( true ) {
                bVar3 = false;
                if (-1 < prc_local) {
                  bitset::operator[](&local_258,(size_t)&this->G);
                  bVar4 = bitset::reference::operator_cast_to_bool((reference *)&local_258);
                  bVar3 = true;
                  if ((bVar4) && (bVar3 = true, this->r[prc_local] <= pe_local)) {
                    bVar3 = pe_local < this->u[prc_local];
                  }
                }
                if (!bVar3) break;
                prc_local = prc_local + -1;
              }
              if (prc_local == -1) {
                v_3 = 1;
              }
              else {
                if (local_cc == 0) {
                  solve(this,prc_local,pe_local,po_local,local_b0,local_b4 / 2);
                }
                else {
                  solve(this,prc_local,pe_local,po_local,local_b0 / 2,local_b4);
                }
                v_3 = 0;
              }
            }
          }
          bitset::~bitset((bitset *)(local_178 + 0x18));
        }
      }
    }
  }
  return;
}

Assistant:

void
PPQSolver::solve(int vtop, const int pr, const int prc, const int pe, const int po)
{
    // track the number of visits
    iterations++;

    // no state change
    if (po == 0 || pe == 0) return;

    // move vtop to the true top, then check for game emptiness
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // const int pr = r[vtop]; // set to highest priority
    const int pl = pr&1;

    // Expand the left side of the current level of the universal tree
    // This is where we use Lehtinen's version, not Pawel's.
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << " (caller pr=" << prc << ")" << std::endl;
#endif

    // after the left side, a lot can be changed, find our new vtop

    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // empty game, bye

    // TODO handle some special cases: entire region in u; nothing left in r; L is smaller than pe/po

    // set R := all vertices with r[v] == pr
    // set L := all vertices with r[v] <= pr and r[v] != -1
    // also add each vertex in R to the attract queue Q

    R.reset();
    L.reset();
    for (int v = vtop; v >= 0; v--) {
        // assumption: if v not in G, then r[v] == -1
        if (r[v] != -1) {
            if (r[v] == pr) {
                R[v] = true; // add to R
                Q.push(v);   // add to Q
            } 
            if (r[v] <= pr) {
                L[v] = true; // add to L
            }
        }
    } 

    // Attract for pl from L to R

    while (Q.nonempty()) {
        int v = Q.pop();
        r[v] = pr;    // set r ; we already know/assume that u[v] == -1
        // L[v] = false; // remove from L
        attractVertices(pl, v, R, L, L);
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = R.find_last(); v != bitset::npos; v = R.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; 
        }
        logger << std::endl;
    }
#endif

    // Now that we have our R, check if it is closed.
    // Simultaneously find lowest escape out of R (for the opponent)

    bool promoted = maybePromote(pr, pl, R, L);

    // if promoted, we don't need to consider the recursive game (according to the paper)
    if (promoted) return;

    // if (promoted) R.reset(); // alternative...

    /** /
    // optimization to not continue if we can be sure that the recursion already took all
    // possible opponent's small dominions
    //
    // sadly, this does not work well with the PP optimization
    L -= R;
    unsigned long count = L.count(); // what remains ?
    if (pl) {
        if (count <= (po/2)) return;
    } else {
        if (count <= (pe/2)) return;
    }
    // */

    // make a local copy of R, because R/L can be destroyed in the recursion
    bitset Z(R);

    // compute next vtop (for subgame) and the next priority
    int next_vtop = vtop;
    while (next_vtop >= 0 and (!G[next_vtop] or r[next_vtop] >= pr or u[next_vtop] >= pr)) next_vtop--;
    if (next_vtop == -1) return; // subgame is actually empty
    const int subpr = r[next_vtop];

    // run recursively
    solve(vtop, subpr, pr, pe, po);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "back from recursive " << subpr << ", we are pr " << pr << ", pe=" << pe << ", po=" << po << std::endl;
    }
#endif

    // Now we must first perform Und
    // There may be a lower u. If same pl pr, then merge with our u. If different pl pr, reset.
    // There may be a lower r. If other pl, then merge to our u

    for (int v = vtop; v >= 0; v--) {
        if (u[v] != -1 and u[v] < pr) {
            // lower u
            if ((u[v]&1) == pl) {
                // same pl pr, so merge
                u[v] = pr;
            } else {
                // other pl pr, so reset
                u[v] = -1;
                r[v] = priority(v);
                str[v] = -1;
            }
        } else if ((subpr&1)!=pl and r[v] != -1 and r[v] < pr) {
            // it's a lower other pl r, merge to our u
            r[v] = -1;
            u[v] = pr;
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mstate after Und\033[m" << std::endl;
        for (auto v = G.find_last(); v != bitset::npos; v = G.find_prev(v)) {
            logger << label_vertex(v) << " r=" << r[v] << " u=" << u[v] << " str=" << label_vertex(str[v]) << std::endl;
        }
    }
#endif

    // after the recursion, R/U/L could be anything...
    // set R := all vertices with r[v] == pr
    // set U := all vertices with u[v] == pr
    // set L := all vertices with r[v] <= pr
    // also add each vertex in U to the attract queue Q

    R.reset();  
    L.reset();
    U.reset();
    for (int v = vtop; v >= 0; v--) {
        if (r[v] == pr) {
            R[v] = true; // add to R
        }
        if (r[v] != -1 && r[v] <= pr) {
            L[v] = true; // add to L
        }
        if (u[v] == pr) {
            U[v] = true; // add to U
            Q.push(v);   // add to Q for attracting from R/L to U
        }
    } 

    // Attract to U from L
    while (Q.nonempty()) {
        int v = Q.pop();
        u[v] = pr;
        r[v] = -1;
        attractVertices(1-pl, v, U, L, L);
    }

    // Update R and L
    R -= U;
    L -= U;

    // Add original R to current R in order to check if we need to reset R
    R |= Z;

    // check if we need to reset the region
    bool reset_R = false;
    for (auto v = R.find_first(); v != bitset::npos; v = R.find_next(v)) {
        // check if a vertex is now in a dominion or in u
        if (r[v] == -1) {
            reset_R = true; // either dominion or in u
            break;
        }
        // check if a vertex is in a higher opponent r
        if (r[v] > pr && (r[v]&1) != pl) {
            reset_R = true;
            break;
        }
        // check if a strategy leaves R
        if (str[v] != -1 && r[str[v]] != pr) {
            reset_R = true;
            break;
        }
    }

    if (reset_R) {
        // reset everything with r <= pr
        for (auto v = vtop; v >= 0; v--) {
            if (r[v] != -1 && r[v] <= pr) {
#ifndef NDEBUG
                if (trace >= 2) logger << "reset " << label_vertex(v) << std::endl;
#endif
                r[v] = priority(v);
                u[v] = -1;
                str[v] = -1;
            }
        }
    } else {
        // we did not reset, try to promote again
        maybePromote(pr, pl, R, L);
        // regardless of the outcome, if nothing reset, no need to go recursive again
        return;
    }

    // move vtop then expand right side of the universal tree
    while (vtop >= 0 and (!G[vtop] or r[vtop] > pr or u[vtop] > pr)) vtop--;
    if (vtop == -1) return; // and we're done, there's nothing left

    // Expand the right side of the current level of the universal tree
    if (pl == 0) solve(vtop, pr, prc, pe, po/2);
    else solve(vtop, pr, prc, pe/2, po);
}